

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_add_checked(roaring_bitmap_t *r,uint32_t val)

{
  int iVar1;
  container_t *pcVar2;
  array_container_t *c;
  container_t *container_1;
  array_container_t *newac;
  int newCardinality;
  container_t *container2;
  uint8_t newtypecode;
  container_t *pcStack_28;
  int oldCardinality;
  container_t *container;
  _Bool result;
  uint8_t typecode;
  int i;
  uint16_t hb;
  roaring_array_t *prStack_10;
  uint32_t val_local;
  roaring_bitmap_t *r_local;
  
  _result = (uint16_t)(val >> 0x10);
  i = val;
  prStack_10 = &r->high_low_container;
  container._4_4_ = ra_get_index(&r->high_low_container,_result);
  container._2_1_ = 0;
  if (container._4_4_ < 0) {
    c = array_container_create();
    pcVar2 = container_add(c,(uint16_t)i,'\x02',(uint8_t *)((long)&container + 3));
    ra_insert_new_key_value_at(prStack_10,-1 - container._4_4_,_result,pcVar2,container._3_1_);
    container._2_1_ = true;
  }
  else {
    ra_unshare_container_at_index(prStack_10,(uint16_t)container._4_4_);
    pcStack_28 = ra_get_container_at_index
                           (prStack_10,(uint16_t)container._4_4_,(uint8_t *)((long)&container + 3));
    container2._4_4_ = container_get_cardinality(pcStack_28,container._3_1_);
    container2._3_1_ = container._3_1_;
    pcVar2 = container_add(pcStack_28,(uint16_t)i,container._3_1_,(uint8_t *)((long)&container2 + 3)
                          );
    if (pcVar2 == pcStack_28) {
      iVar1 = container_get_cardinality(pcStack_28,container2._3_1_);
      container._2_1_ = container2._4_4_ != iVar1;
    }
    else {
      container_free(pcStack_28,container._3_1_);
      ra_set_container_at_index(prStack_10,container._4_4_,pcVar2,container2._3_1_);
      container._2_1_ = true;
    }
  }
  return (_Bool)container._2_1_;
}

Assistant:

bool roaring_bitmap_add_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
            result = true;
        } else {
            const int newCardinality =
                container_get_cardinality(container, newtypecode);

            result = oldCardinality != newCardinality;
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
        result = true;
    }

    return result;
}